

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_enum_field.cc
# Opt level: O2

void __thiscall
google::protobuf::compiler::java::ImmutableEnumFieldGenerator::GenerateInterfaceMembers
          (ImmutableEnumFieldGenerator *this,Printer *printer)

{
  FieldDescriptor *field;
  
  field = this->descriptor_;
  if (*(int *)(*(long *)(field + 0x30) + 0x8c) != 3) {
    WriteFieldDocComment(printer,field);
    io::Printer::Print(printer,&this->variables_,"$deprecation$boolean has$capitalized_name$();\n");
    field = this->descriptor_;
    if (*(int *)(*(long *)(field + 0x30) + 0x8c) != 3) goto LAB_002c3e98;
  }
  WriteFieldDocComment(printer,field);
  io::Printer::Print(printer,&this->variables_,"$deprecation$int get$capitalized_name$Value();\n");
  field = this->descriptor_;
LAB_002c3e98:
  WriteFieldDocComment(printer,field);
  io::Printer::Print(printer,&this->variables_,"$deprecation$$type$ get$capitalized_name$();\n");
  return;
}

Assistant:

void ImmutableEnumFieldGenerator::
GenerateInterfaceMembers(io::Printer* printer) const {
  if (SupportFieldPresence(descriptor_->file())) {
    WriteFieldDocComment(printer, descriptor_);
    printer->Print(variables_,
      "$deprecation$boolean has$capitalized_name$();\n");
  }
  if (SupportUnknownEnumValue(descriptor_->file())) {
    WriteFieldDocComment(printer, descriptor_);
    printer->Print(variables_,
      "$deprecation$int get$capitalized_name$Value();\n");
  }
  WriteFieldDocComment(printer, descriptor_);
  printer->Print(variables_,
    "$deprecation$$type$ get$capitalized_name$();\n");
}